

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_FuncTableAlloc(char *group,TA_StringTable **table)

{
  TA_FuncInfo *pTVar1;
  bool bVar2;
  uint i_1;
  int iVar3;
  long lVar4;
  TA_StringTable *table_00;
  char **ppcVar5;
  char *pcVar6;
  uint nbFuncFound;
  TA_RetCode TVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  
  if (table == (TA_StringTable **)0x0 || group == (char *)0x0) {
    TVar7 = TA_BAD_PARAM;
  }
  else {
    *table = (TA_StringTable *)0x0;
    TVar7 = TA_GROUP_NOT_FOUND;
    for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
      iVar3 = strcmp(TA_GroupString[lVar13],group);
      if (iVar3 == 0) {
        uVar8 = 0;
        for (lVar4 = 0; lVar4 != 0x1a; lVar4 = lVar4 + 1) {
          for (uVar9 = 0; *TA_DEF_TablesSize[lVar4] != uVar9; uVar9 = uVar9 + 1) {
            if (TA_DEF_Tables[lVar4][uVar9] != (TA_FuncDef *)0x0) {
              uVar8 = (ulong)((int)uVar8 +
                             (uint)(TA_DEF_Tables[lVar4][uVar9]->groupId == (TA_GroupId)lVar13));
            }
          }
        }
        table_00 = (TA_StringTable *)calloc(1,0x1c);
        if (table_00 == (TA_StringTable *)0x0) {
          *table = (TA_StringTable *)0x0;
        }
        else {
          table_00[1].size = 0xa20cb20c;
          table_00->hiddenData = table_00 + 1;
          table_00->size = (uint)uVar8;
          if ((uint)uVar8 == 0) {
LAB_00119218:
            *table = table_00;
            return TA_SUCCESS;
          }
          ppcVar5 = (char **)calloc(1,uVar8 * 8);
          table_00->string = ppcVar5;
          if (ppcVar5 != (char **)0x0) {
            uVar9 = 0;
            pcVar6 = (char *)0x0;
            while( true ) {
              if (uVar9 == uVar8) goto LAB_00119218;
              uVar10 = 0;
              bVar2 = false;
              uVar11 = 0;
              while ((uVar10 < 0x1a && (!bVar2))) {
                uVar12 = 0;
                bVar2 = false;
                while ((uVar12 < *TA_DEF_TablesSize[uVar10] && (!bVar2))) {
                  bVar2 = false;
                  if (TA_DEF_Tables[uVar10][uVar12]->groupId == (TA_GroupId)lVar13) {
                    bVar2 = false;
                    if (uVar9 == uVar11) {
                      pTVar1 = TA_DEF_Tables[uVar10][uVar12]->funcInfo;
                      if (pTVar1 == (TA_FuncInfo *)0x0) goto LAB_001191f2;
                      pcVar6 = pTVar1->name;
                      bVar2 = true;
                    }
                    uVar11 = (ulong)((int)uVar11 + 1);
                  }
                  uVar12 = uVar12 + 1;
                }
                uVar10 = uVar10 + 1;
              }
              if ((!bVar2) || (pcVar6 == (char *)0x0)) break;
              table_00->string[uVar9] = pcVar6;
              uVar9 = uVar9 + 1;
            }
          }
LAB_001191f2:
          *table = (TA_StringTable *)0x0;
          TA_FuncTableFree(table_00);
        }
        return TA_ALLOC_ERR;
      }
    }
  }
  return TVar7;
}

Assistant:

TA_RetCode TA_FuncTableAlloc( const char *group, TA_StringTable **table )
{
   TA_RetCode retCode;
   unsigned int i;
   TA_StringTable *stringTable;
   unsigned int groupId; /* TA_GroupId */
   unsigned int groupSize;
   const char *stringPtr;
   TA_StringTablePriv *stringTablePriv;

   if( (group == NULL) || (table == NULL ) )
   {
      return TA_BAD_PARAM;
   }

   *table = NULL;
   stringPtr = NULL;

   /* Get information on the group. */
   retCode = getGroupId( group, &groupId );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   retCode = getGroupSize( (TA_GroupId)groupId, &groupSize );
   if( retCode != TA_SUCCESS )
   {
      return retCode;
   }

   /* Allocate the table. */

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_FUNC_MAGIC_NB;
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */
   stringTable->size = groupSize;
   if( groupSize != 0 )
   {
      stringTable->string = (const char **)TA_Malloc( (stringTable->size) *
                                                      sizeof(const char *) );

      if( stringTable->string == NULL )
      {
         *table = NULL;
         TA_FuncTableFree( stringTable );
         return TA_ALLOC_ERR;
      }

      memset( (void *)stringTable->string, 0,
              (stringTable->size) * sizeof(const char *) );

      for( i=0; i < stringTable->size; i++ )
      {
         retCode = getFuncNameByIdx( (TA_GroupId)groupId, i, &stringPtr );

         if( retCode != TA_SUCCESS )
         {
            *table = NULL;
            TA_FuncTableFree( stringTable );
            return TA_ALLOC_ERR;
         }

         (stringTable->string)[i] = stringPtr;
      }
   }

   /* Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}